

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandStime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  SC_Lib *pLib;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_40;
  uint local_3c;
  int nTreeCRatio;
  int fDumpStats;
  int fPrintPath;
  int fUseWireLoads;
  int fShowAll;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fPrintPath = 0;
  fDumpStats = 0;
  nTreeCRatio = 0;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Xcapdh");
    if (iVar1 == -1) {
      pAVar2 = Abc_FrameReadNtk(pAbc);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Err,"There is no current network.\n");
        return 1;
      }
      pAVar2 = Abc_FrameReadNtk(pAbc);
      iVar1 = Abc_NtkHasMapping(pAVar2);
      if (iVar1 == 0) {
        fprintf((FILE *)pAbc->Err,"The current network is not mapped.\n");
        return 1;
      }
      pAVar2 = Abc_FrameReadNtk(pAbc);
      iVar1 = Abc_SclCheckNtk(pAVar2,0);
      if (iVar1 == 0) {
        fprintf((FILE *)pAbc->Err,"The current network is not in a topo order (run \"topo\").\n");
        return 1;
      }
      if (pAbc->pLibScl == (void *)0x0) {
        fprintf((FILE *)pAbc->Err,"There is no Liberty library available.\n");
        return 1;
      }
      pLib = (SC_Lib *)pAbc->pLibScl;
      pAVar2 = Abc_FrameReadNtk(pAbc);
      Abc_SclTimePerform(pLib,pAVar2,local_40,fDumpStats,fPrintPath,nTreeCRatio,local_3c);
      return 0;
    }
    switch(iVar1) {
    case 0x58:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-X\" should be followed by a positive integer.\n");
        goto LAB_004947f9;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((int)local_40 < 0) {
LAB_004947f9:
        fprintf((FILE *)pAbc->Err,"usage: stime [-X num] [-capdth]\n");
        fprintf((FILE *)pAbc->Err,"\t         performs STA using Liberty library\n");
        fprintf((FILE *)pAbc->Err,
                "\t-X     : min Cout/Cave ratio for tree estimations [default = %d]\n",
                (ulong)local_40);
        pcVar3 = "no";
        if (fDumpStats != 0) {
          pcVar3 = "yes";
        }
        fprintf((FILE *)pAbc->Err,"\t-c     : toggle using wire-loads if specified [default = %s]\n"
                ,pcVar3);
        pcVar3 = "no";
        if (fPrintPath != 0) {
          pcVar3 = "yes";
        }
        fprintf((FILE *)pAbc->Err,
                "\t-a     : display timing information for all nodes [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (nTreeCRatio != 0) {
          pcVar3 = "yes";
        }
        fprintf((FILE *)pAbc->Err,
                "\t-p     : display timing information for critical path [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_3c != 0) {
          pcVar3 = "yes";
        }
        fprintf((FILE *)pAbc->Err,
                "\t-d     : toggle dumping statistics into a file [default = %s]\n",pcVar3);
        fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
        return 1;
      }
      break;
    default:
      goto LAB_004947f9;
    case 0x61:
      fPrintPath = fPrintPath ^ 1;
      break;
    case 99:
      fDumpStats = fDumpStats ^ 1;
      break;
    case 100:
      local_3c = local_3c ^ 1;
      break;
    case 0x68:
      goto LAB_004947f9;
    case 0x70:
      nTreeCRatio = nTreeCRatio ^ 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandStime( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;
    int fShowAll      = 0;
    int fUseWireLoads = 0;
    int fPrintPath    = 0;
    int fDumpStats    = 0;
    int nTreeCRatio   = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Xcapdh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'X':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nTreeCRatio = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nTreeCRatio < 0 ) 
                    goto usage;
                break;
            case 'c':
                fUseWireLoads ^= 1;
                break;
            case 'a':
                fShowAll ^= 1;
                break;
            case 'p':
                fPrintPath ^= 1;
                break;
            case 'd':
                fDumpStats ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }

    Abc_SclTimePerform( (SC_Lib *)pAbc->pLibScl, Abc_FrameReadNtk(pAbc), nTreeCRatio, fUseWireLoads, fShowAll, fPrintPath, fDumpStats );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: stime [-X num] [-capdth]\n" );
    fprintf( pAbc->Err, "\t         performs STA using Liberty library\n" );
    fprintf( pAbc->Err, "\t-X     : min Cout/Cave ratio for tree estimations [default = %d]\n", nTreeCRatio );
    fprintf( pAbc->Err, "\t-c     : toggle using wire-loads if specified [default = %s]\n", fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-a     : display timing information for all nodes [default = %s]\n", fShowAll? "yes": "no" );
    fprintf( pAbc->Err, "\t-p     : display timing information for critical path [default = %s]\n", fPrintPath? "yes": "no" );
    fprintf( pAbc->Err, "\t-d     : toggle dumping statistics into a file [default = %s]\n", fDumpStats? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    return 1;
}